

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::ArrayBuilder<capnp::compiler::BrandedDecl>::~ArrayBuilder
          (ArrayBuilder<capnp::compiler::BrandedDecl> *this)

{
  BrandedDecl *pBVar1;
  RemoveConst<capnp::compiler::BrandedDecl> *pRVar2;
  BrandedDecl *pBVar3;
  
  pBVar1 = this->ptr;
  if (pBVar1 != (BrandedDecl *)0x0) {
    pRVar2 = this->pos;
    pBVar3 = this->endPtr;
    this->ptr = (BrandedDecl *)0x0;
    this->pos = (RemoveConst<capnp::compiler::BrandedDecl> *)0x0;
    this->endPtr = (BrandedDecl *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pBVar1,0xa8,((long)pRVar2 - (long)pBVar1 >> 3) * -0x30c30c30c30c30c3,
               ((long)pBVar3 - (long)pBVar1 >> 3) * -0x30c30c30c30c30c3,
               ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }